

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O1

bool __thiscall
BamTools::Internal::BamReaderPrivate::CreateIndex(BamReaderPrivate *this,IndexType *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  string message;
  string bracError;
  string local_78;
  string local_58;
  string local_38;
  
  bVar2 = BgzfStream::IsOpen(&this->m_stream);
  if (bVar2) {
    bVar2 = BamRandomAccessController::CreateIndex(&this->m_randomAccessController,this,type);
    if (bVar2) {
      return true;
    }
    BamRandomAccessController::GetErrorString_abi_cxx11_(&local_58,&this->m_randomAccessController);
    paVar1 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"could not create index: \n\t","");
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_38,(ulong)local_58._M_dataplus._M_p);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_78.field_2._M_allocated_capacity = *psVar4;
      local_78.field_2._8_8_ = plVar3[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar4;
      local_78._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_78._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    local_38._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"BamReader::CreateIndex","")
    ;
    SetErrorString(this,&local_38,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return false;
    }
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"BamReader::CreateIndex","")
    ;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"cannot create index on unopened BAM file","");
    SetErrorString(this,&local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return false;
    }
  }
  operator_delete(local_58._M_dataplus._M_p);
  return false;
}

Assistant:

bool BamReaderPrivate::CreateIndex(const BamIndex::IndexType& type)
{

    // skip if BAM file not open
    if (!IsOpen()) {
        SetErrorString("BamReader::CreateIndex", "cannot create index on unopened BAM file");
        return false;
    }

    // attempt to create index
    if (m_randomAccessController.CreateIndex(this, type))
        return true;
    else {
        const std::string bracError = m_randomAccessController.GetErrorString();
        const std::string message = std::string("could not create index: \n\t") + bracError;
        SetErrorString("BamReader::CreateIndex", message);
        return false;
    }
}